

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqllogictest.cpp
# Opt level: O0

void testRunner<false,true>(void)

{
  undefined1 uVar1;
  IResultCapture *pIVar2;
  IContext *pIVar3;
  element_type *peVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  InvalidInputException *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> test_working_dir;
  size_t found;
  string prev_directory;
  SQLLogicTestRunner runner;
  string storage_name;
  string initial_dbpath;
  string name;
  string *in_stack_00000c98;
  SQLLogicTestRunner *in_stack_00000ca0;
  string *this_00;
  char *in_stack_fffffffffffff9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f0;
  allocator *in_stack_fffffffffffff9f8;
  string *suffix;
  undefined7 in_stack_fffffffffffffa30;
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [39];
  undefined1 local_541;
  string local_520 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_500;
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [224];
  string *in_stack_fffffffffffffc28;
  SQLLogicTestRunner *in_stack_fffffffffffffc30;
  string local_240 [32];
  string local_220 [39];
  undefined1 local_1f9 [40];
  allocator local_1d1;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  string local_120 [32];
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  string local_90 [32];
  string local_70;
  string local_40 [32];
  string local_20 [32];
  
  pIVar2 = Catch::getResultCapture();
  (*pIVar2->_vptr_IResultCapture[0x15])(local_20);
  std::__cxx11::string::string(local_40);
  uVar1 = duckdb::TestForceStorage();
  if ((bool)uVar1) {
    std::__cxx11::string::string(local_90,local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"/",&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"_",&local_d9);
    duckdb::StringUtil::Replace(&local_70,local_90,local_b0,local_d8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::string(local_120,(string *)&local_70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,".",&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"_",&local_169);
    duckdb::StringUtil::Replace(local_100,local_120,local_140,local_168);
    suffix = &local_70;
    std::__cxx11::string::operator=((string *)suffix,local_100);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::string(local_1b0,(string *)suffix);
    in_stack_fffffffffffff9f8 = &local_1d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"\\",in_stack_fffffffffffff9f8);
    in_stack_fffffffffffff9f0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_1f9 + 1),"_",(allocator *)in_stack_fffffffffffff9f0);
    duckdb::StringUtil::Replace(local_190,local_1b0,local_1d0,local_1f9 + 1);
    std::__cxx11::string::operator=((string *)&local_70,local_190);
    std::__cxx11::string::~string(local_190);
    std::__cxx11::string::~string((string *)(local_1f9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1f9);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    std::__cxx11::string::~string(local_1b0);
    std::operator+(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
    duckdb::TestCreatePath(suffix);
    std::__cxx11::string::operator=(local_40,local_220);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::string(local_4b8,local_40);
  duckdb::SQLLogicTestRunner::SQLLogicTestRunner
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_4b8);
  pIVar3 = Catch::getCurrentContext();
  (*pIVar3->_vptr_IContext[4])();
  peVar4 = Catch::clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x7de98b);
  (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0x17])();
  std::__cxx11::string::string(local_4d8);
  duckdb::TestGetCurrentDirectory_abi_cxx11_();
  this_00 = local_4f8;
  std::__cxx11::string::operator=(local_4d8,this_00);
  std::__cxx11::string::~string(this_00);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::__cxx11::string::rfind((char *)local_20,0x8c21ac);
  local_500 = __lhs;
  if (__lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)local_568,(ulong)local_20);
    std::__cxx11::string::string(local_588,local_568);
    duckdb::TestChangeDirectory((string *)0x7debcf);
    std::__cxx11::string::~string(local_588);
    std::__cxx11::string::~string(local_568);
    std::__cxx11::string::string(local_5a8,local_20);
    duckdb::SQLLogicTestRunner::ExecuteFile(in_stack_00000ca0,in_stack_00000c98);
    std::__cxx11::string::~string(local_5a8);
    std::__cxx11::string::string(local_5c8,local_4d8);
    duckdb::TestChangeDirectory((string *)0x7dec4a);
    std::__cxx11::string::~string(local_5c8);
    duckdb::ClearTestDirectory();
    std::__cxx11::string::~string(local_4d8);
    duckdb::SQLLogicTestRunner::~SQLLogicTestRunner
              ((SQLLogicTestRunner *)CONCAT17(uVar1,in_stack_fffffffffffffa30));
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string(local_20);
    return;
  }
  local_541 = 1;
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  std::operator+((char *)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  std::operator+(__lhs,(char *)this_00);
  duckdb::InvalidInputException::InvalidInputException(this,local_520);
  local_541 = 0;
  __cxa_throw(this,&duckdb::InvalidInputException::typeinfo,
              duckdb::InvalidInputException::~InvalidInputException);
}

Assistant:

static void testRunner() {
	// this is an ugly hack that uses the test case name to pass the script file
	// name if someone has a better idea...
	auto name = Catch::getResultCapture().getCurrentTestName();
	// fprintf(stderr, "%s\n", name.c_str());
	string initial_dbpath;
	if (TestForceStorage()) {
		auto storage_name = StringUtil::Replace(name, "/", "_");
		storage_name = StringUtil::Replace(storage_name, ".", "_");
		storage_name = StringUtil::Replace(storage_name, "\\", "_");
		initial_dbpath = TestCreatePath(storage_name + ".db");
	}
	SQLLogicTestRunner runner(std::move(initial_dbpath));
	runner.output_sql = Catch::getCurrentContext().getConfig()->outputSQL();
	runner.enable_verification = VERIFICATION;

	string prev_directory;

	// We assume the test working dir for extensions to be one dir above the test/sql. Note that this is very hacky.
	// however for now it suffices: we use it to run tests from out-of-tree extensions that are based on the extension
	// template which adheres to this convention.
	if (AUTO_SWITCH_TEST_DIR) {
		prev_directory = TestGetCurrentDirectory();

		std::size_t found = name.rfind("test/sql");
		if (found == std::string::npos) {
			throw InvalidInputException("Failed to auto detect working dir for test '" + name +
			                            "' because a non-standard path was used!");
		}
		auto test_working_dir = name.substr(0, found);

		// Parse the test dir automatically
		TestChangeDirectory(test_working_dir);
	}

	runner.ExecuteFile(name);

	if (AUTO_SWITCH_TEST_DIR) {
		TestChangeDirectory(prev_directory);
	}

	// clear test directory after running tests
	ClearTestDirectory();
}